

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O0

int __thiscall QDialPrivate::valueFromPoint(QDialPrivate *this,QPoint *p)

{
  int iVar1;
  int iVar2;
  QDialPrivate *in_RDI;
  double dVar3;
  double __x;
  int v;
  int r;
  int maxv;
  int minv;
  int dist;
  double a;
  double xx;
  double yy;
  QDial *q;
  int local_6c;
  double local_68;
  int local_44;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  
  q_func(in_RDI);
  iVar1 = QWidget::height((QWidget *)0x56ad90);
  iVar2 = QPoint::y((QPoint *)0x56adb0);
  dVar3 = (double)iVar1 / 2.0 - (double)iVar2;
  iVar1 = QPoint::x((QPoint *)0x56adce);
  iVar2 = QWidget::width((QWidget *)0x56ade2);
  __x = (double)iVar1 - (double)iVar2 / 2.0;
  if ((((__x != 0.0) || (NAN(__x))) || (dVar3 != 0.0)) || (NAN(dVar3))) {
    local_68 = atan2(dVar3,__x);
  }
  else {
    local_68 = 0.0;
  }
  local_30 = local_68;
  if (local_68 < -1.5707963267948966) {
    local_30 = local_68 + 6.283185307179586;
  }
  local_34 = 0;
  local_38 = *(int *)&(in_RDI->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
  local_3c = (in_RDI->super_QAbstractSliderPrivate).maximum;
  if (*(int *)&(in_RDI->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254 < 0) {
    local_34 = -*(int *)&(in_RDI->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254;
    local_38 = 0;
    local_3c = (in_RDI->super_QAbstractSliderPrivate).maximum + local_34;
  }
  if (((byte)in_RDI->field_0x298 >> 1 & 1) == 0) {
    dVar3 = (double)local_38 + 0.5 +
            ((double)(local_3c - local_38) * (4.1887902047863905 - local_30)) / 5.235987755982989;
  }
  else {
    dVar3 = (double)local_38 + 0.5 +
            ((double)(local_3c - local_38) * (4.71238898038469 - local_30)) / 6.283185307179586;
  }
  local_44 = (int)dVar3;
  if (0 < local_34) {
    local_44 = local_44 - local_34;
  }
  if (((byte)(in_RDI->super_QAbstractSliderPrivate).field_0x27c >> 3 & 1) == 0) {
    local_6c = (**(code **)(*(long *)&(in_RDI->super_QAbstractSliderPrivate).super_QWidgetPrivate +
                           0xa8))(in_RDI,local_44);
  }
  else {
    local_6c = (in_RDI->super_QAbstractSliderPrivate).maximum;
    iVar1 = (**(code **)(*(long *)&(in_RDI->super_QAbstractSliderPrivate).super_QWidgetPrivate +
                        0xa8))(in_RDI,local_44);
    local_6c = local_6c - iVar1;
  }
  return local_6c;
}

Assistant:

int QDialPrivate::valueFromPoint(const QPoint &p) const
{
    Q_Q(const QDial);
    double yy = q->height()/2.0 - p.y();
    double xx = p.x() - q->width()/2.0;
    double a = (xx || yy) ? std::atan2(yy, xx) : 0;

    if (a < Q_PI / -2)
        a = a + Q_PI * 2;

    int dist = 0;
    int minv = minimum, maxv = maximum;

    if (minimum < 0) {
        dist = -minimum;
        minv = 0;
        maxv = maximum + dist;
    }

    int r = maxv - minv;
    int v;
    if (wrapping)
        v =  (int)(0.5 + minv + r * (Q_PI * 3 / 2 - a) / (2 * Q_PI));
    else
        v =  (int)(0.5 + minv + r* (Q_PI * 4 / 3 - a) / (Q_PI * 10 / 6));

    if (dist > 0)
        v -= dist;

    return !invertedAppearance ? bound(v) : maximum - bound(v);
}